

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O2

JObject * __thiscall
pstack::JObject::field<char[19],unsigned_long,char>
          (JObject *this,char (*k) [19],unsigned_long *v,char *c)

{
  ostream *os;
  char (*local_40) [19];
  Field<char[19],_unsigned_long> field;
  
  local_40 = k;
  field.k = (char (*) [19])v;
  os = std::operator<<(this->os,this->sep);
  field.v = (unsigned_long *)&local_40;
  pstack::operator<<(os,(JSON<pstack::Field<char[19],_unsigned_long>,_char> *)&field.v);
  this->sep = ", ";
  return this;
}

Assistant:

JObject &field(const K &k, const V&v, const C &c = C()) {
         Field<K,V> field(k, v);
         os << sep << json(field, c);
         sep = ", ";
         return *this;
      }